

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void threadsafe_mem_leak_free(void *buffer,char *file,size_t line)

{
  MemoryLeakDetector *pMVar1;
  TestMemoryAllocator *in_RDX;
  MemoryLeakDetector *in_RSI;
  MemLeakScopedMutex lock;
  char *in_stack_ffffffffffffffb8;
  MemoryLeakDetector *in_stack_ffffffffffffffc0;
  undefined1 allocatNodesSeperately;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  MemLeakScopedMutex::MemLeakScopedMutex((MemLeakScopedMutex *)in_stack_ffffffffffffffc0);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  allocatNodesSeperately = (undefined1)((ulong)pMVar1 >> 0x38);
  MemoryLeakDetector::invalidateMemory(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  MemoryLeakWarningPlugin::getGlobalDetector();
  getCurrentMallocAllocator();
  MemoryLeakDetector::deallocMemory
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,(bool)allocatNodesSeperately);
  MemLeakScopedMutex::~MemLeakScopedMutex((MemLeakScopedMutex *)0x16d820);
  return;
}

Assistant:

static void threadsafe_mem_leak_free(void* buffer, const char* file, size_t line)
{
    MemLeakScopedMutex lock;
    MemoryLeakWarningPlugin::getGlobalDetector()->invalidateMemory((char*) buffer);
    MemoryLeakWarningPlugin::getGlobalDetector()->deallocMemory(getCurrentMallocAllocator(), (char*) buffer, file, line, true);
}